

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

ParseResult * __thiscall
cxxopts::OptionParser::parse
          (ParseResult *__return_storage_ptr__,OptionParser *this,int argc,char **argv)

{
  _Hash_node_base *p_Var1;
  key_type *__k;
  undefined8 uVar2;
  element_type *peVar3;
  bool bVar4;
  _Alloc_hider _Var5;
  ParseResult *pPVar6;
  byte bVar7;
  int iVar8;
  mapped_type *pmVar9;
  const_iterator cVar10;
  mapped_type *pmVar11;
  size_t sVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  _Atomic_word *p_Var14;
  size_type *psVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  shared_ptr<cxxopts::OptionDetails> *psVar19;
  char *pcVar20;
  _Hash_node_base *p_Var21;
  pointer __k_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  size_type sVar23;
  int current;
  size_t hash;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  shared_ptr<cxxopts::OptionDetails> opt;
  string name;
  shared_ptr<cxxopts::OptionDetails> value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unmatched;
  ParseResult *parsed;
  size_t hash_1;
  int local_148;
  int local_144;
  string local_140;
  char **local_120;
  undefined1 local_118 [32];
  undefined8 local_f8;
  shared_ptr<const_cxxopts::OptionDetails> local_f0;
  string local_e0;
  shared_ptr<cxxopts::OptionDetails> local_c0;
  undefined4 local_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_88;
  vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  ParseResult *local_58;
  size_t local_50;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_48;
  
  local_148 = 1;
  __k_00 = (this->m_positional->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ac = (undefined4)CONCAT71((int7)((ulong)this->m_positional >> 8),1);
  local_144 = argc;
  local_120 = argv;
  local_58 = __return_storage_ptr__;
  if (argc != 1) {
    local_88 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->m_parsed;
    local_80 = (vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)&this->m_sequential;
    do {
      paVar22 = &local_140.field_2;
      pcVar20 = local_120[local_148];
      if (((*pcVar20 == '-') && (pcVar20[1] == '-')) && (pcVar20[2] == '\0')) {
        local_148 = local_148 + 1;
        local_ac = 0;
        break;
      }
      local_118._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_118._24_8_ = 0;
      local_118._0_8_ = (element_type *)0x0;
      local_118._8_8_ = (element_type *)0x0;
      sVar12 = strlen(pcVar20);
      std::__detail::
      __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                (pcVar20,pcVar20 + sVar12,
                 (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  *)local_118,
                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 (anonymous_namespace)::option_matcher_abi_cxx11_,0);
      lVar16 = local_118._8_8_ - local_118._0_8_;
      uVar17 = (lVar16 >> 3) * -0x5555555555555555;
      if (uVar17 < 4) {
        pcVar20 = local_120[local_148];
        if (((*pcVar20 == '-') && (pcVar20[1] != '\0')) && (this->m_allow_unrecognised == false)) {
          std::__cxx11::string::string((string *)&local_140,pcVar20,(allocator *)&local_e0);
          throw_or_mimic<cxxopts::option_syntax_exception>(&local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar22) {
            operator_delete(local_140._M_dataplus._M_p,
                            CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                     local_140.field_2._M_local_buf[0]) + 1);
          }
          pcVar20 = local_120[local_148];
        }
        std::__cxx11::string::string((string *)&local_140,pcVar20,(allocator *)&local_a8);
        while (__k_00 != (this->m_positional->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
          cVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this->m_options->_M_h,__k_00);
          if (cVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            throw_or_mimic<cxxopts::option_not_exists_exception>(__k_00);
          }
          else {
            local_e0._M_dataplus._M_p =
                 *(pointer *)
                  (*(long *)((long)cVar10.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                   ._M_cur + 0x28) + 0x78);
            pmVar9 = std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_88,(key_type *)&local_e0);
            psVar19 = (shared_ptr<cxxopts::OptionDetails> *)
                      ((long)cVar10.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 0x28);
            iVar8 = (*((((psVar19->
                         super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->m_value).
                       super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->_vptr_Value[6])();
            if ((char)iVar8 != '\0') {
              bVar4 = true;
              parse_option(this,psVar19,__k_00,&local_140);
              goto LAB_0010f85a;
            }
            if (pmVar9->m_count == 0) {
              parse_option(this,psVar19,__k_00,&local_140);
              __k_00 = __k_00 + 1;
              bVar4 = true;
              goto LAB_0010f85a;
            }
            __k_00 = __k_00 + 1;
          }
        }
        bVar4 = false;
LAB_0010f85a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar22) {
          operator_delete(local_140._M_dataplus._M_p,
                          CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                   local_140.field_2._M_local_buf[0]) + 1);
        }
        if (bVar4) goto LAB_0010f8ba;
        std::__cxx11::string::string
                  ((string *)&local_140,local_120[local_148],(allocator *)&local_e0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_140);
LAB_0010f8a8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,
                          CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                   local_140.field_2._M_local_buf[0]) + 1);
        }
LAB_0010f8ba:
        local_148 = local_148 + 1;
      }
      else {
        if (local_118._0_8_ == local_118._8_8_) {
          if ((*(char *)(local_118._0_8_ + lVar16 + -0x38) == '\x01') &&
             (*(long *)(local_118._0_8_ + lVar16 + -0x40) !=
              *(long *)(local_118._0_8_ + lVar16 + -0x48))) {
LAB_0010f599:
            p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (local_118._0_8_ + lVar16 + -0x48);
LAB_0010f5a0:
            if (*(char *)&p_Var13[1]._vptr__Sp_counted_base == '\x01') {
              uVar2._0_4_ = p_Var13->_M_use_count;
              uVar2._4_4_ = p_Var13->_M_weak_count;
              local_140._M_dataplus._M_p = (pointer)paVar22;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_140,(_Hash_node_base *)p_Var13->_vptr__Sp_counted_base,
                         uVar2);
              if (local_140._M_string_length != 0) {
                sVar23 = 0;
                do {
                  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_e0,'\x01');
                  cVar10 = std::
                           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           ::find(&this->m_options->_M_h,&local_e0);
                  if (cVar10.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                      ._M_cur == (__node_type *)0x0) {
                    if (this->m_allow_unrecognised == false) {
                      throw_or_mimic<cxxopts::option_not_exists_exception>(&local_e0);
                      goto LAB_0010f616;
                    }
                  }
                  else {
LAB_0010f616:
                    local_c0.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = *(element_type **)
                              ((long)cVar10.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                     ._M_cur + 0x28);
                    local_c0.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          ((long)cVar10.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                 ._M_cur + 0x30);
                    if (local_c0.
                        super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_c0.
                         super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_c0.
                              super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_c0.
                         super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_c0.
                              super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    if (sVar23 + 1 == local_140._M_string_length) {
                      checked_parse_arg(this,local_144,local_120,&local_148,&local_c0,&local_e0);
                    }
                    else {
                      iVar8 = (*(((local_c0.
                                   super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->m_value).
                                 super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_Value[7])();
                      if ((char)iVar8 == '\0') {
                        throw_or_mimic<cxxopts::option_requires_argument_exception>(&local_e0);
                      }
                      else {
                        (*(((local_c0.
                             super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_value).
                           super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_vptr_Value[9])(&local_a8);
                        local_50 = (local_c0.
                                    super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->m_hash;
                        pmVar9 = std::__detail::
                                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[](local_88,&local_50);
                        local_f0.
                        super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = local_c0.
                                  super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr;
                        local_f0.
                        super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi =
                             local_c0.
                             super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                        if (local_c0.
                            super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                           ) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            (local_c0.
                             super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count =
                                 (local_c0.
                                  super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            (local_c0.
                             super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count =
                                 (local_c0.
                                  super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_M_use_count + 1;
                          }
                        }
                        OptionValue::ensure_value(pmVar9,&local_f0);
                        pmVar9->m_count = pmVar9->m_count + 1;
                        peVar3 = (pmVar9->m_value).
                                 super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
                        (*peVar3->_vptr_Value[3])(peVar3,&local_a8);
                        pmVar9->m_long_name =
                             &(local_f0.
                               super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_long;
                        if (local_f0.
                            super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_f0.
                                     super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
                        }
                        std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
                        emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                  (local_80,&(local_c0.
                                              super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->m_long,&local_a8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                          operator_delete(local_a8._M_dataplus._M_p,
                                          local_a8.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                    if (local_c0.
                        super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_c0.
                                 super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                    operator_delete(local_e0._M_dataplus._M_p,
                                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                             local_e0.field_2._M_local_buf[0]) + 1);
                  }
                  sVar23 = sVar23 + 1;
                } while (sVar23 != local_140._M_string_length);
              }
            }
            else {
              local_140._M_string_length = 0;
              local_140.field_2._M_local_buf[0] = '\0';
              local_140._M_dataplus._M_p = (pointer)paVar22;
            }
            goto LAB_0010f8a8;
          }
          goto LAB_0010f8ba;
        }
        if (uVar17 - 8 < 0xfffffffffffffffb) {
          if ((*(char *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118._0_8_ + 0x70))
                         ->_vptr__Sp_counted_base == '\x01') &&
             (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118._0_8_ + 0x68))->_M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118._0_8_ + 0x60))->
              _vptr__Sp_counted_base)) {
            p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118._0_8_ + 0x60);
            goto LAB_0010f5a0;
          }
        }
        else if ((*(char *)(local_118._0_8_ + lVar16 + -0x38) == '\x01') &&
                (*(long *)(local_118._0_8_ + lVar16 + -0x40) !=
                 *(long *)(local_118._0_8_ + lVar16 + -0x48))) goto LAB_0010f599;
        if (0xfffffffffffffffd < uVar17 - 5) {
          if ((*(char *)(local_118._0_8_ + lVar16 + -0x38) == '\x01') &&
             (*(long *)(local_118._0_8_ + lVar16 + -0x40) !=
              *(long *)(local_118._0_8_ + lVar16 + -0x48))) {
            p_Var14 = (_Atomic_word *)(local_118._0_8_ + lVar16 + -0x48);
            goto LAB_0010f900;
          }
          goto LAB_0010f8ba;
        }
        if (((char)*(size_type *)(local_118._0_8_ + 0x28) != '\x01') ||
           ((_Hash_node_base *)
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118._0_8_ + 0x20))->
            _vptr__Sp_counted_base == *(_Hash_node_base **)(local_118._0_8_ + 0x18)))
        goto LAB_0010f8ba;
        p_Var14 = (_Atomic_word *)(local_118._0_8_ + 0x18);
LAB_0010f900:
        if (*(char *)&((_Hash_node_base *)(p_Var14 + 4))->_M_nxt == '\x01') {
          local_140._M_dataplus._M_p = (pointer)paVar22;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,*(_Hash_node_base **)p_Var14,
                     ((_Hash_node_base *)(p_Var14 + 2))->_M_nxt);
        }
        else {
          local_140._M_string_length = 0;
          local_140.field_2._M_local_buf[0] = '\0';
          local_140._M_dataplus._M_p = (pointer)paVar22;
        }
        cVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this->m_options->_M_h,&local_140);
        if (cVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
            ._M_cur != (__node_type *)0x0) {
LAB_0010f9c9:
          local_f0.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)
                    ((long)cVar10.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                           ._M_cur + 0x28);
          local_f0.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                       ._M_cur + 0x30);
          if (local_f0.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_f0.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_f0.
                    super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_f0.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_f0.
                    super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          lVar16 = local_118._8_8_ - local_118._0_8_;
          if ((lVar16 == 0) ||
             (lVar18 = (lVar16 >> 3) * -0x5555555555555555, 0xfffffffffffffffc < lVar18 - 6U)) {
            if ((*(char *)(local_118._0_8_ + lVar16 + -0x38) == '\x01') &&
               (*(long *)(local_118._0_8_ + lVar16 + -0x40) !=
                *(long *)(local_118._0_8_ + lVar16 + -0x48))) {
LAB_0010fa56:
              psVar15 = (size_type *)(local_118._0_8_ + lVar16 + -0x48);
              goto LAB_0010fa5d;
            }
LAB_0010fa7e:
            checked_parse_arg(this,local_144,local_120,&local_148,
                              (shared_ptr<cxxopts::OptionDetails> *)&local_f0,&local_140);
          }
          else {
            if ((*(char *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118._0_8_ + 0x40)
                           )->_vptr__Sp_counted_base != '\x01') ||
               (*(_Hash_node_base **)(local_118._0_8_ + 0x38) ==
                (_Hash_node_base *)
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_118._0_8_ + 0x30))->
                _vptr__Sp_counted_base)) goto LAB_0010fa7e;
            if (0xfffffffffffffffb < lVar18 - 7U) goto LAB_0010fa56;
            psVar15 = (size_type *)(local_118._0_8_ + 0x48);
LAB_0010fa5d:
            if (*(char *)&((_Hash_node_base *)(psVar15 + 2))->_M_nxt == '\x01') {
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,(_Hash_node_base *)*psVar15,
                         (_Hash_node_base *)
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(psVar15 + 1))->_M_allocated_capacity);
            }
            else {
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              local_e0._M_string_length = 0;
              local_e0.field_2._M_local_buf[0] = '\0';
            }
            local_c0.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 (local_f0.
                  super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_hash;
            pmVar9 = std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_88,(key_type *)&local_c0);
            local_a8._M_dataplus._M_p =
                 (pointer)local_f0.
                          super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
            local_a8._M_string_length =
                 (size_type)
                 local_f0.
                 super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if (local_f0.
                super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_f0.
                 super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_f0.
                      super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_f0.
                 super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_f0.
                      super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            OptionValue::ensure_value(pmVar9,(shared_ptr<const_cxxopts::OptionDetails> *)&local_a8);
            pmVar9->m_count = pmVar9->m_count + 1;
            peVar3 = (pmVar9->m_value).
                     super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (*peVar3->_vptr_Value[3])(peVar3,&local_e0);
            pmVar9->m_long_name = (string *)(local_a8._M_dataplus._M_p + 0x20);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
            }
            std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
            emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      (local_80,&(local_f0.
                                  super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_long,&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,
                              CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                       local_e0.field_2._M_local_buf[0]) + 1);
            }
          }
          if (local_f0.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f0.
                       super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          goto LAB_0010f8a8;
        }
        if (this->m_allow_unrecognised != true) {
          throw_or_mimic<cxxopts::option_not_exists_exception>(&local_140);
          goto LAB_0010f9c9;
        }
        std::__cxx11::string::string
                  ((string *)&local_e0,local_120[local_148],(allocator *)&local_a8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                   local_e0.field_2._M_local_buf[0]) + 1);
        }
        local_148 = local_148 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar22) {
          operator_delete(local_140._M_dataplus._M_p,
                          CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                   local_140.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((element_type *)local_118._0_8_ != (element_type *)0x0) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
      }
    } while (local_148 != local_144);
  }
  p_Var21 = (this->m_options->_M_h)._M_before_begin._M_nxt;
  if (p_Var21 != (_Hash_node_base *)0x0) {
    do {
      p_Var1 = p_Var21[5]._M_nxt[0xc]._M_nxt;
      local_118._0_8_ = p_Var21[5]._M_nxt[0xf]._M_nxt;
      pmVar9 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->m_parsed,(key_type *)local_118);
      bVar7 = (*(code *)p_Var1->_M_nxt[5]._M_nxt)(p_Var1);
      if (((bVar7 & pmVar9->m_count == 0) == 1) && (pmVar9->m_default == false)) {
        local_118._0_8_ = p_Var21[5]._M_nxt[0xf]._M_nxt;
        pmVar9 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->m_parsed,(key_type *)local_118);
        local_118._0_8_ = p_Var21[5]._M_nxt;
        local_118._8_8_ = p_Var21[6]._M_nxt;
        if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar15 = &(((element_type *)local_118._8_8_)->m_short)._M_string_length;
            *(int *)psVar15 = (int)*psVar15 + 1;
            UNLOCK();
          }
          else {
            psVar15 = &(((element_type *)local_118._8_8_)->m_short)._M_string_length;
            *(int *)psVar15 = (int)*psVar15 + 1;
          }
        }
        OptionValue::ensure_value(pmVar9,(shared_ptr<const_cxxopts::OptionDetails> *)local_118);
        pmVar9->m_default = true;
        pmVar9->m_long_name = (string *)(local_118._0_8_ + 0x20);
        (*((pmVar9->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr_Value[4])();
        if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
      }
      p_Var21 = p_Var21->_M_nxt;
    } while (p_Var21 != (_Hash_node_base *)0x0);
  }
  if ((char)local_ac == '\0') {
    if (local_148 < local_144) {
      do {
        std::__cxx11::string::string
                  ((string *)local_118,local_120[local_148],(allocator *)&local_e0);
        if (__k_00 == (this->m_positional->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          bVar4 = false;
        }
        else {
          do {
            cVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&this->m_options->_M_h,__k_00);
            if (cVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              throw_or_mimic<cxxopts::option_not_exists_exception>(__k_00);
            }
            else {
              local_140._M_dataplus._M_p =
                   *(pointer *)
                    (*(long *)((long)cVar10.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                     ._M_cur + 0x28) + 0x78);
              pmVar9 = std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->m_parsed,(key_type *)&local_140);
              psVar19 = (shared_ptr<cxxopts::OptionDetails> *)
                        ((long)cVar10.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                               ._M_cur + 0x28);
              iVar8 = (*((((psVar19->
                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_value).
                         super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        )->_vptr_Value[6])();
              if ((char)iVar8 != '\0') {
                bVar4 = true;
                parse_option(this,psVar19,__k_00,(string *)local_118);
                goto LAB_0010f212;
              }
              if (pmVar9->m_count == 0) {
                parse_option(this,psVar19,__k_00,(string *)local_118);
                __k_00 = __k_00 + 1;
                bVar4 = true;
                goto LAB_0010f212;
              }
              __k_00 = __k_00 + 1;
            }
          } while (__k_00 != (this->m_positional->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
          bVar4 = false;
        }
LAB_0010f212:
        if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
      } while ((bVar4) && (local_148 = local_148 + 1, local_148 < local_144));
    }
    if (local_148 != local_144) {
      do {
        std::__cxx11::string::string
                  ((string *)local_118,local_120[local_148],(allocator *)&local_140);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
        if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        local_148 = local_148 + 1;
      } while (local_148 != local_144);
    }
  }
  p_Var21 = (this->m_options->_M_h)._M_before_begin._M_nxt;
  if (p_Var21 != (_Hash_node_base *)0x0) {
    do {
      __k = (key_type *)p_Var21[5]._M_nxt;
      paVar22 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)((long)&__k[3].field_2 + 8);
      local_140._M_dataplus._M_p = (pointer)paVar22;
      pmVar11 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_keys,__k);
      _Var5._M_p = local_140._M_dataplus._M_p;
      *pmVar11 = (mapped_type)paVar22;
      pmVar11 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_keys,__k + 1);
      *pmVar11 = (mapped_type)_Var5._M_p;
      local_118._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_118._24_8_ = 0;
      local_118._0_8_ = (element_type *)0x0;
      local_118._8_8_ = (element_type *)0x0;
      local_f8 = 0;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_long&,cxxopts::OptionValue>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->m_parsed,&local_140,local_118);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._16_8_);
      }
      p_Var21 = p_Var21->_M_nxt;
    } while (p_Var21 != (_Hash_node_base *)0x0);
  }
  pPVar6 = local_58;
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseResult::ParseResult(local_58,&this->m_keys,&this->m_parsed,&local_48,&local_78);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return pPVar6;
}

Assistant:

inline ParseResult
OptionParser::parse(int argc, const char* const* argv)
{
  int current = 1;
  bool consume_remaining = false;
  PositionalListIterator next_positional = m_positional.begin();

  std::vector<std::string> unmatched;

  while (current != argc)
  {
    if (strcmp(argv[current], "--") == 0)
    {
      consume_remaining = true;
      ++current;
      break;
    }

    std::match_results<const char*> result;
    std::regex_match(argv[current], result, option_matcher);

    if (result.empty())
    {
      //not a flag

      // but if it starts with a `-`, then it's an error
      if (argv[current][0] == '-' && argv[current][1] != '\0') {
        if (!m_allow_unrecognised) {
          throw_or_mimic<option_syntax_exception>(argv[current]);
        }
      }

      //if true is returned here then it was consumed, otherwise it is
      //ignored
      if (consume_positional(argv[current], next_positional))
      {
      }
      else
      {
        unmatched.push_back(argv[current]);
      }
      //if we return from here then it was parsed successfully, so continue
    }
    else
    {
      //short or long option?
      if (result[4].length() != 0)
      {
        const std::string& s = result[4];

        for (std::size_t i = 0; i != s.size(); ++i)
        {
          std::string name(1, s[i]);
          auto iter = m_options.find(name);

          if (iter == m_options.end())
          {
            if (m_allow_unrecognised)
            {
              continue;
            }
            //error
            throw_or_mimic<option_not_exists_exception>(name);
          }

          auto value = iter->second;

          if (i + 1 == s.size())
          {
            //it must be the last argument
            checked_parse_arg(argc, argv, current, value, name);
          }
          else if (value->value().has_implicit())
          {
            parse_option(value, name, value->value().get_implicit_value());
          }
          else
          {
            //error
            throw_or_mimic<option_requires_argument_exception>(name);
          }
        }
      }
      else if (result[1].length() != 0)
      {
        const std::string& name = result[1];

        auto iter = m_options.find(name);

        if (iter == m_options.end())
        {
          if (m_allow_unrecognised)
          {
            // keep unrecognised options in argument list, skip to next argument
            unmatched.push_back(argv[current]);
            ++current;
            continue;
          }
          //error
          throw_or_mimic<option_not_exists_exception>(name);
        }

        auto opt = iter->second;

        //equals provided for long option?
        if (result[2].length() != 0)
        {
          //parse the option given

          parse_option(opt, name, result[3]);
        }
        else
        {
          //parse the next argument
          checked_parse_arg(argc, argv, current, opt, name);
        }
      }

    }

    ++current;
  }

  for (auto& opt : m_options)
  {
    auto& detail = opt.second;
    const auto& value = detail->value();

    auto& store = m_parsed[detail->hash()];

    if(value.has_default() && !store.count() && !store.has_default()){
      parse_default(detail);
    }
  }

  if (consume_remaining)
  {
    while (current < argc)
    {
      if (!consume_positional(argv[current], next_positional)) {
        break;
      }
      ++current;
    }

    //adjust argv for any that couldn't be swallowed
    while (current != argc) {
      unmatched.push_back(argv[current]);
      ++current;
    }
  }

  finalise_aliases();

  ParseResult parsed(std::move(m_keys), std::move(m_parsed), std::move(m_sequential), std::move(unmatched));
  return parsed;
}